

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Printer::PrintAny
          (Printer *this,Message *message,TextGenerator *generator)

{
  Finder *pFVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Descriptor *type;
  Message *pMVar4;
  MessageLite *this_00;
  FastFieldValuePrinter *pFVar5;
  LogMessage *pLVar6;
  Reflection *this_01;
  LogFinisher local_141;
  FieldDescriptor *value_field;
  FieldDescriptor *type_url_field;
  string local_130;
  string full_type_name;
  string url_prefix;
  string serialized_value;
  DynamicMessageFactory factory;
  LogMessage local_68;
  undefined4 extraout_var_00;
  
  bVar2 = internal::GetAnyFieldDescriptors(message,&type_url_field,&value_field);
  if (!bVar2) {
    return false;
  }
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  Reflection::GetString_abi_cxx11_(&local_130,this_01,message,type_url_field);
  url_prefix._M_dataplus._M_p = (pointer)&url_prefix.field_2;
  url_prefix._M_string_length = 0;
  url_prefix.field_2._M_local_buf[0] = '\0';
  full_type_name._M_dataplus._M_p = (pointer)&full_type_name.field_2;
  full_type_name._M_string_length = 0;
  full_type_name.field_2._M_local_buf[0] = '\0';
  bVar2 = internal::ParseAnyTypeUrl(&local_130,&url_prefix,&full_type_name);
  if (bVar2) {
    pFVar1 = this->finder_;
    if (pFVar1 == (Finder *)0x0) {
      type = anon_unknown_19::DefaultFinderFindAnyType(message,&url_prefix,&full_type_name);
    }
    else {
      iVar3 = (*pFVar1->_vptr_Finder[4])(pFVar1,message,&url_prefix,&full_type_name);
      type = (Descriptor *)CONCAT44(extraout_var,iVar3);
    }
    if (type != (Descriptor *)0x0) {
      DynamicMessageFactory::DynamicMessageFactory(&factory);
      pMVar4 = DynamicMessageFactory::GetPrototype(&factory,type);
      iVar3 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[3])(pMVar4);
      this_00 = (MessageLite *)CONCAT44(extraout_var_00,iVar3);
      Reflection::GetString_abi_cxx11_(&serialized_value,this_01,message,value_field);
      bVar2 = MessageLite::ParseFromString(this_00,&serialized_value);
      if (bVar2) {
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,"[",1);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_130._M_dataplus._M_p,local_130._M_string_length);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,"]",1);
        pFVar5 = GetFieldPrinter(this,value_field);
        (*pFVar5->_vptr_FastFieldValuePrinter[0xe])
                  (pFVar5,message,0xffffffffffffffff,0,(ulong)this->single_line_mode_,generator);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])(generator);
        Print(this,(Message *)this_00,generator);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[3])(generator);
        (*pFVar5->_vptr_FastFieldValuePrinter[0xf])
                  (pFVar5,message,0xffffffffffffffff,0,(ulong)this->single_line_mode_,generator);
      }
      else {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_WARNING,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/text_format.cc"
                   ,0x7a0);
        pLVar6 = internal::LogMessage::operator<<(&local_68,&local_130);
        pLVar6 = internal::LogMessage::operator<<(pLVar6,": failed to parse contents");
        internal::LogFinisher::operator=(&local_141,pLVar6);
        internal::LogMessage::~LogMessage(&local_68);
      }
      std::__cxx11::string::~string((string *)&serialized_value);
      (*this_00->_vptr_MessageLite[1])(this_00);
      DynamicMessageFactory::~DynamicMessageFactory(&factory);
      goto LAB_0027e398;
    }
    internal::LogMessage::LogMessage
              ((LogMessage *)&factory,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/text_format.cc"
               ,0x798);
    pLVar6 = internal::LogMessage::operator<<((LogMessage *)&factory,"Proto type ");
    pLVar6 = internal::LogMessage::operator<<(pLVar6,&local_130);
    pLVar6 = internal::LogMessage::operator<<(pLVar6," not found");
    internal::LogFinisher::operator=((LogFinisher *)&local_68,pLVar6);
    internal::LogMessage::~LogMessage((LogMessage *)&factory);
  }
  bVar2 = false;
LAB_0027e398:
  std::__cxx11::string::~string((string *)&full_type_name);
  std::__cxx11::string::~string((string *)&url_prefix);
  std::__cxx11::string::~string((string *)&local_130);
  return bVar2;
}

Assistant:

bool TextFormat::Printer::PrintAny(const Message& message,
                                   TextGenerator* generator) const {
  const FieldDescriptor* type_url_field;
  const FieldDescriptor* value_field;
  if (!internal::GetAnyFieldDescriptors(message, &type_url_field,
                                        &value_field)) {
    return false;
  }

  const Reflection* reflection = message.GetReflection();

  // Extract the full type name from the type_url field.
  const std::string& type_url = reflection->GetString(message, type_url_field);
  std::string url_prefix;
  std::string full_type_name;
  if (!internal::ParseAnyTypeUrl(type_url, &url_prefix, &full_type_name)) {
    return false;
  }

  // Print the "value" in text.
  const Descriptor* value_descriptor =
      finder_ ? finder_->FindAnyType(message, url_prefix, full_type_name)
              : DefaultFinderFindAnyType(message, url_prefix, full_type_name);
  if (value_descriptor == nullptr) {
    GOOGLE_LOG(WARNING) << "Proto type " << type_url << " not found";
    return false;
  }
  DynamicMessageFactory factory;
  std::unique_ptr<Message> value_message(
      factory.GetPrototype(value_descriptor)->New());
  std::string serialized_value = reflection->GetString(message, value_field);
  if (!value_message->ParseFromString(serialized_value)) {
    GOOGLE_LOG(WARNING) << type_url << ": failed to parse contents";
    return false;
  }
  generator->PrintLiteral("[");
  generator->PrintString(type_url);
  generator->PrintLiteral("]");
  const FastFieldValuePrinter* printer = GetFieldPrinter(value_field);
  printer->PrintMessageStart(message, -1, 0, single_line_mode_, generator);
  generator->Indent();
  Print(*value_message, generator);
  generator->Outdent();
  printer->PrintMessageEnd(message, -1, 0, single_line_mode_, generator);
  return true;
}